

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::
FunctionMockerBase<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::~FunctionMockerBase
          (FunctionMockerBase<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *this)

{
  UntypedFunctionMockerBase *unaff_RBX;
  
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0015b738;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
            (&this->super_UntypedFunctionMockerBase);
  Mock::UnregisterLocked(unaff_RBX);
  (*(this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase[2])(this);
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  .
  super__Head_base<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
  ._M_head_impl.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0015b7d0;
  linked_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  ::~linked_ptr(&(this->current_spec_).matchers_.
                 super__Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                 .
                 super__Head_base<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
                 ._M_head_impl.
                 super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 .impl_);
  UntypedFunctionMockerBase::~UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }